

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O0

void __thiscall winmd::reader::cache::remove_type(cache *this,string_view *ns,string_view *name)

{
  bool bVar1;
  pointer ppVar2;
  undefined1 local_39;
  namespace_members *pnStack_38;
  anon_class_1_0_00000001 remove;
  namespace_members *members;
  _Self local_28;
  iterator m;
  string_view *name_local;
  string_view *ns_local;
  cache *this_local;
  
  m._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       cppwinrt::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
       ::find(&this->m_namespaces,ns);
  members = (namespace_members *)
            cppwinrt::std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
            ::end(&this->m_namespaces);
  bVar1 = cppwinrt::std::operator==(&local_28,(_Self *)&members);
  if (!bVar1) {
    ppVar2 = cppwinrt::std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>
             ::operator->(&local_28);
    pnStack_38 = &ppVar2->second;
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_39,&(ppVar2->second).interfaces,
               (basic_string_view<char,_std::char_traits<char>_> *)m._M_node);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_39,&pnStack_38->classes,
               (basic_string_view<char,_std::char_traits<char>_> *)m._M_node);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_39,&pnStack_38->enums,
               (basic_string_view<char,_std::char_traits<char>_> *)m._M_node);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_39,&pnStack_38->structs,
               (basic_string_view<char,_std::char_traits<char>_> *)m._M_node);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_39,&pnStack_38->delegates,
               (basic_string_view<char,_std::char_traits<char>_> *)m._M_node);
  }
  return;
}

Assistant:

void remove_type(std::string_view const& ns, std::string_view const& name)
        {
            auto m = m_namespaces.find(ns);
            if (m == m_namespaces.end())
            {
                return;
            }
            auto& members = m->second;

            auto remove = [&](auto&& collection, auto&& name)
            {
                auto pos = std::find_if(collection.begin(), collection.end(), [&](auto&& type)
                    {
                        return type.TypeName() == name;
                    });

                if (pos != collection.end())
                {
                    collection.erase(pos);
                }
            };

            remove(members.interfaces, name);
            remove(members.classes, name);
            remove(members.enums, name);
            remove(members.structs, name);
            remove(members.delegates, name);
        }